

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O1

Error __thiscall asmjit::v1_14::CodeHolder::relocateToBase(CodeHolder *this,uint64_t baseAddress)

{
  int iVar1;
  uint uVar2;
  Section *pSVar3;
  OffsetFormat OVar4;
  long lVar5;
  OffsetFormat OVar6;
  undefined1 uVar7;
  char cVar8;
  bool bVar9;
  Error EVar10;
  char cVar11;
  byte bVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  uint64_t *extraout_RDX;
  uint64_t *extraout_RDX_00;
  uint64_t *out;
  OffsetFormat *unaff_RBP;
  OffsetFormat OVar16;
  OffsetFormat OVar17;
  uint uVar18;
  long lVar19;
  Value VVar20;
  Value VVar21;
  long lVar22;
  OffsetFormat unaff_R13;
  long *plVar23;
  bool bVar24;
  uint64_t value;
  OffsetFormat OStack_c8;
  ulong uStack_c0;
  ulong uStack_b8;
  OffsetFormat OStack_b0;
  Value VStack_a8;
  Value VStack_a0;
  OffsetFormat OStack_98;
  CodeHolder *pCStack_90;
  long *plStack_88;
  OffsetFormat *pOStack_80;
  Arch local_69;
  OffsetFormat local_68;
  ulong local_60;
  Section *local_58;
  uint64_t local_50;
  uint8_t *local_48;
  ulong local_40;
  long *local_38;
  
  if (baseAddress == 0xffffffffffffffff) {
LAB_00119ab6:
    VVar20.constant = 2;
LAB_00119a87:
    return (Error)VVar20.constant;
  }
  this->_baseAddress = baseAddress;
  local_69 = (this->_environment)._arch;
  pSVar3 = this->_addressTableSection;
  VVar20.constant = 0;
  OVar16 = (OffsetFormat)baseAddress;
  OVar17 = (OffsetFormat)this;
  if (pSVar3 == (Section *)0x0) {
    local_48 = (uint8_t *)0x0;
  }
  else {
    unaff_R13 = (OffsetFormat)&pSVar3->_buffer;
    if (((pSVar3->_buffer)._capacity < pSVar3->_virtualSize) &&
       (VVar20.constant = 9, ((pSVar3->_buffer)._flags & kIsFixed) == kNone)) {
      pOStack_80 = (OffsetFormat *)0x119aa4;
      OVar16 = unaff_R13;
      EVar10 = CodeHolder_reserveInternal(this,(CodeBuffer *)unaff_R13,pSVar3->_virtualSize);
      VVar20.constant._4_4_ = 0;
      VVar20.constant._0_4_ = EVar10;
    }
    if ((int)VVar20.constant != 0) goto LAB_00119a87;
    local_48 = ((CodeBuffer *)unaff_R13)->_data;
  }
  bVar24 = (ulong)*(uint *)&this->field_0x110 == 0;
  local_58 = pSVar3;
  if (bVar24) {
    local_60 = 0;
    plVar23 = (long *)baseAddress;
  }
  else {
    plVar23 = *(long **)&this->_relocations;
    local_38 = plVar23 + *(uint *)&this->field_0x110;
    local_40 = (ulong)(local_69 & k32BitMask) ^ 3;
    local_60 = 0;
    VVar21 = VVar20;
    local_50 = baseAddress;
    do {
      unaff_RBP = (OffsetFormat *)*plVar23;
      iVar1 = *(int *)&unaff_RBP->_valueOffset;
      if (iVar1 == 0) {
        cVar11 = '\x05';
        VVar20 = VVar21;
      }
      else {
        uVar18._0_1_ = unaff_RBP[2]._type;
        uVar18._1_1_ = unaff_RBP[2]._flags;
        uVar18._2_1_ = unaff_RBP[2]._regionSize;
        uVar18._3_1_ = unaff_RBP[2]._valueSize;
        if (*(uint *)&this->field_0xe0 <= uVar18) {
          pOStack_80 = (OffsetFormat *)0x119ab1;
          relocateToBase();
LAB_00119ab1:
          pOStack_80 = (OffsetFormat *)0x119ab6;
          relocateToBase();
          goto LAB_00119ab6;
        }
        lVar22 = *(long *)(*(long *)&this->_sections + (ulong)uVar18 * 8);
        uVar2._0_1_ = unaff_RBP[2]._valueOffset;
        uVar2._1_1_ = unaff_RBP[2]._immBitCount;
        uVar2._2_1_ = unaff_RBP[2]._immBitShift;
        uVar2._3_1_ = unaff_RBP[2]._immDiscardLsb;
        OVar16._type = ~kSignedOffset;
        OVar16._flags = 0xff;
        OVar16._regionSize = 0xff;
        OVar16._valueSize = 0xff;
        OVar16._valueOffset = '\0';
        OVar16._immBitCount = '\0';
        OVar16._immBitShift = '\0';
        OVar16._immDiscardLsb = '\0';
        if ((ulong)uVar2 == 0xffffffff) {
          lVar19 = 0;
        }
        else {
          if (*(uint *)&this->field_0xe0 <= uVar2) goto LAB_00119ab1;
          lVar19 = *(long *)(*(long *)&this->_sections + (ulong)uVar2 * 8);
        }
        OVar17 = unaff_RBP[4];
        OVar4 = unaff_RBP[3];
        VVar20.constant = 0x17;
        cVar11 = '\x01';
        local_68 = OVar17;
        if ((((ulong)OVar4 < (ulong)*(OffsetFormat *)(lVar22 + 0x50)) &&
            (OVar16._flags = '\0', OVar16._regionSize = '\0', OVar16._valueSize = '\0',
            OVar16._valueOffset = '\0', OVar16._immBitCount = '\0', OVar16._immBitShift = '\0',
            OVar16._immDiscardLsb = '\0', OVar16._type = unaff_RBP[1]._regionSize,
            (ulong)OVar16 <= (ulong)((long)*(OffsetFormat *)(lVar22 + 0x50) - (long)OVar4))) &&
           (iVar1 - 1U < 5)) {
          lVar5 = *(long *)(lVar22 + 0x10);
          unaff_R13 = *(OffsetFormat *)(lVar22 + 0x48);
          switch(iVar1) {
          case 1:
            OVar16 = (OffsetFormat)&local_68;
            pOStack_80 = (OffsetFormat *)0x11983b;
            EVar10 = CodeHolder_evaluateExpression
                               ((CodeHolder *)OVar17,(Expression *)OVar16,(uint64_t *)0x17);
            if (EVar10 != 0) {
              VVar20.constant._4_4_ = 0;
              VVar20.constant._0_4_ = EVar10;
              cVar11 = (EVar10 == 0) * '\x05' + '\x01';
              goto LAB_00119a1c;
            }
            break;
          case 3:
            if (lVar19 == 0) goto LAB_00119a1c;
            local_68 = (OffsetFormat)((long)OVar17 + local_50 + *(long *)(lVar19 + 0x10));
            break;
          case 4:
            OVar17 = (OffsetFormat)((long)OVar17 - ((long)OVar4 + (long)OVar16 + lVar5 + local_50));
            if ((local_69 & k32BitMask) == kUnknown) {
              VVar20.constant = 0x18;
              local_68 = OVar17;
              if ((OffsetFormat)(long)OVar17._0_4_ != OVar17) goto LAB_00119a1c;
            }
            else {
              local_68 = (OffsetFormat)(long)OVar17._0_4_;
            }
            break;
          case 5:
            uVar15 = (ulong)unaff_RBP[1]._valueOffset + (long)OVar4;
            if (uVar15 < 2 || unaff_RBP[1]._valueSize != '\x04') {
              VVar21.constant = 0x17;
              cVar11 = '\x01';
              cVar8 = '\0';
            }
            else {
              local_68 = (OffsetFormat)
                         ((long)OVar17 - ((long)OVar4 + (long)OVar16 + local_50 + lVar5));
              if ((OffsetFormat)(long)local_68._0_4_ == local_68) {
                cVar11 = '\x06';
                cVar8 = '\x01';
              }
              else {
                for (uVar14 = *(ulong *)&this->_addressTableEntries; uVar14 != 0;
                    uVar14 = *(ulong *)(uVar14 + (ulong)(uVar18 >> 0x1f) * 8) & 0xfffffffffffffffe)
                {
                  OVar6 = *(OffsetFormat *)(uVar14 + 0x10);
                  uVar18 = (uint)((ulong)OVar6 >= (ulong)OVar17 && OVar6 != OVar17) -
                           (uint)((ulong)OVar6 < (ulong)OVar17);
                  if (uVar18 == 0) goto LAB_00119941;
                }
                uVar14 = 0;
LAB_00119941:
                if (uVar14 == 0) {
LAB_001199b6:
                  cVar8 = '\0';
                  VVar21.constant = 0x17;
                }
                else {
                  VVar20 = VVar21;
                  if (local_58 == (Section *)0x0) goto LAB_00119ac3;
                  if (*(int *)(uVar14 + 0x18) == -1) {
                    *(int *)(uVar14 + 0x18) = (int)local_60;
                    local_60 = (ulong)((int)local_60 + 1);
                  }
                  OVar17 = (OffsetFormat)
                           ((ulong)*(uint *)(uVar14 + 0x18) << ((byte)local_40 & 0x3f));
                  local_68 = (OffsetFormat)
                             ((local_58->_offset - ((long)OVar4 + lVar5 + (long)OVar16)) +
                             (long)OVar17);
                  if ((OffsetFormat)(long)local_68._0_4_ == local_68) {
                    if (((undefined1 *)((long)unaff_R13 + -1))[uVar15] == -0x18) {
                      uVar7 = 0x15;
                    }
                    else {
                      if (((undefined1 *)((long)unaff_R13 + -1))[uVar15] != -0x17)
                      goto LAB_001199b6;
                      uVar7 = 0x25;
                    }
                    ((undefined1 *)((long)unaff_R13 + -2))[uVar15] = 0xff;
                    ((undefined1 *)((long)unaff_R13 + -1))[uVar15] = uVar7;
                    *(OffsetFormat *)(local_48 + (long)OVar17) = unaff_RBP[4];
                    cVar8 = '\x01';
                  }
                  else {
                    VVar21.constant = 0x18;
                    cVar8 = '\0';
                  }
                }
                cVar11 = cVar8 * '\x05' + '\x01';
              }
            }
            VVar20 = VVar21;
            if (cVar8 == '\0') goto LAB_00119a1c;
          }
          unaff_R13 = (OffsetFormat)((long)unaff_R13 + (long)unaff_RBP[3]);
          unaff_RBP = unaff_RBP + 1;
          pOStack_80 = (OffsetFormat *)0x119a03;
          OVar16 = local_68;
          OVar17 = unaff_R13;
          bVar9 = CodeWriterUtils::writeOffset((void *)unaff_R13,(int64_t)local_68,unaff_RBP);
          cVar11 = !bVar9;
          VVar20 = VVar21;
          if (!bVar9) {
            VVar20.constant = 0x17;
          }
        }
      }
LAB_00119a1c:
      if ((cVar11 != '\x05') && (cVar11 != '\0')) break;
      plVar23 = plVar23 + 1;
      bVar24 = plVar23 == local_38;
      VVar21 = VVar20;
    } while (!bVar24);
  }
  if (bVar24 == false) goto LAB_00119a87;
  if (*(int *)&this->field_0xf0 == 0) {
    pOStack_80 = (OffsetFormat *)0x119ac3;
    relocateToBase();
LAB_00119ac3:
    pOStack_80 = (OffsetFormat *)0x119ac8;
    relocateToBase();
  }
  else {
    VVar20.constant = 0;
    if (*(Section **)(*(long *)&this->_sectionsByOrder + (ulong)(*(int *)&this->field_0xf0 - 1) * 8)
        != local_58) goto LAB_00119a87;
    if (local_58 != (Section *)0x0) {
      uVar15 = (ulong)(uint)((int)local_60 << (local_69 & k32BitMask ^ kRISCV32));
      (local_58->_buffer)._size = uVar15;
      local_58->_virtualSize = uVar15;
      goto LAB_00119a87;
    }
  }
  pOStack_80 = (OffsetFormat *)CodeHolder_evaluateExpression;
  relocateToBase();
  lVar22 = 1;
  bVar9 = false;
  out = extraout_RDX;
  OStack_c8 = OVar16;
  VStack_a0 = VVar20;
  OStack_98 = unaff_R13;
  pCStack_90 = this;
  plStack_88 = plVar23;
  pOStack_80 = unaff_RBP;
  VStack_a8.constant._0_1_ = bVar24;
  VStack_a8.constant._1_7_ = (int7)((ulong)pSVar3 >> 8);
  do {
    switch(*(undefined1 *)((long)OVar17 + lVar22)) {
    case 0:
      OStack_b0._type = kSignedOffset;
      OStack_b0._flags = '\0';
      OStack_b0._regionSize = '\0';
      OStack_b0._valueSize = '\0';
      OStack_b0._valueOffset = '\0';
      OStack_b0._immBitCount = '\0';
      OStack_b0._immBitShift = '\0';
      OStack_b0._immDiscardLsb = '\0';
      break;
    case 1:
      OStack_b0 = *(OffsetFormat *)((long)OVar17 + lVar22 * 8);
      break;
    case 2:
      lVar19 = *(long *)((long)OVar17 + lVar22 * 8);
      lVar5 = *(long *)(lVar19 + 0x20);
      if (lVar5 != 0) {
        OStack_b0 = (OffsetFormat)(*(long *)(lVar19 + 0x18) + *(long *)(lVar5 + 0x10));
        break;
      }
      unaff_RBP = (OffsetFormat *)0x43;
LAB_00119b74:
      bVar24 = false;
      goto LAB_00119b76;
    case 3:
      EVar10 = CodeHolder_evaluateExpression
                         (*(CodeHolder **)((long)OVar17 + lVar22 * 8),(Expression *)&OStack_b0,out);
      unaff_RBP = (OffsetFormat *)((ulong)unaff_RBP & 0xffffffff);
      out = extraout_RDX_00;
      if (EVar10 != 0) {
        unaff_RBP = (OffsetFormat *)(ulong)EVar10;
        goto LAB_00119b74;
      }
      break;
    default:
      bVar24 = false;
      unaff_RBP = (OffsetFormat *)0x3;
      goto LAB_00119b76;
    }
    (&OStack_c8)[lVar22] = OStack_b0;
    bVar24 = true;
LAB_00119b76:
    if (!bVar24) break;
    lVar22 = lVar22 + 1;
    bVar9 = lVar22 != 2;
  } while (lVar22 == 2);
  if (!bVar9) {
    return (Error)unaff_RBP;
  }
  bVar12 = (byte)uStack_b8;
  switch(*(undefined1 *)OVar17) {
  case 0:
    uVar15 = uStack_b8 + uStack_c0;
    break;
  case 1:
    uVar15 = uStack_c0 - uStack_b8;
    break;
  case 2:
    uVar15 = uStack_b8 * uStack_c0;
    break;
  case 3:
    uStack_c0 = uStack_c0 << (bVar12 & 0x3f);
    goto LAB_00119be8;
  case 4:
    uStack_c0 = uStack_c0 >> (bVar12 & 0x3f);
LAB_00119be8:
    uVar15 = 0;
    if (uStack_b8 < 0x40) {
      uVar15 = uStack_c0;
    }
    break;
  case 5:
    bVar13 = 0x3f;
    if (uStack_b8 < 0x3f) {
      bVar13 = bVar12;
    }
    uVar15 = (long)uStack_c0 >> (bVar13 & 0x3f);
    break;
  default:
    return 3;
  }
  *(ulong *)OStack_c8 = uVar15;
  return 0;
}

Assistant:

Error CodeHolder::relocateToBase(uint64_t baseAddress) noexcept {
  // Base address must be provided.
  if (ASMJIT_UNLIKELY(baseAddress == Globals::kNoBaseAddress))
    return DebugUtils::errored(kErrorInvalidArgument);

  _baseAddress = baseAddress;
  uint32_t addressSize = _environment.registerSize();

  Section* addressTableSection = _addressTableSection;
  uint32_t addressTableEntryCount = 0;
  uint8_t* addressTableEntryData = nullptr;

  if (addressTableSection) {
    ASMJIT_PROPAGATE(
      reserveBuffer(&addressTableSection->_buffer, size_t(addressTableSection->virtualSize())));
    addressTableEntryData = addressTableSection->_buffer.data();
  }

  // Relocate all recorded locations.
  for (const RelocEntry* re : _relocations) {
    // Possibly deleted or optimized-out entry.
    if (re->relocType() == RelocType::kNone)
      continue;

    Section* sourceSection = sectionById(re->sourceSectionId());
    Section* targetSection = nullptr;

    if (re->targetSectionId() != Globals::kInvalidId)
      targetSection = sectionById(re->targetSectionId());

    uint64_t value = re->payload();
    uint64_t sectionOffset = sourceSection->offset();
    uint64_t sourceOffset = re->sourceOffset();

    // Make sure that the `RelocEntry` doesn't go out of bounds.
    size_t regionSize = re->format().regionSize();
    if (ASMJIT_UNLIKELY(re->sourceOffset() >= sourceSection->bufferSize() ||
                        sourceSection->bufferSize() - size_t(re->sourceOffset()) < regionSize))
      return DebugUtils::errored(kErrorInvalidRelocEntry);

    uint8_t* buffer = sourceSection->data();

    switch (re->relocType()) {
      case RelocType::kExpression: {
        Expression* expression = (Expression*)(uintptr_t(value));
        ASMJIT_PROPAGATE(CodeHolder_evaluateExpression(this, expression, &value));
        break;
      }

      case RelocType::kAbsToAbs: {
        break;
      }

      case RelocType::kRelToAbs: {
        // Value is currently a relative offset from the start of its section.
        // We have to convert it to an absolute offset (including base address).
        if (ASMJIT_UNLIKELY(!targetSection))
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        //value += baseAddress + sectionOffset + sourceOffset + regionSize;
        value += baseAddress + targetSection->offset();
        break;
      }

      case RelocType::kAbsToRel: {
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;

        // Sign extend as we are not interested in the high 32-bit word in a 32-bit address space.
        if (addressSize <= 4)
          value = uint64_t(int64_t(int32_t(value & 0xFFFFFFFFu)));
        else if (!Support::isInt32(int64_t(value)))
          return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

        break;
      }

      case RelocType::kX64AddressEntry: {
        size_t valueOffset = size_t(re->sourceOffset()) + re->format().valueOffset();
        if (re->format().valueSize() != 4 || valueOffset < 2)
          return DebugUtils::errored(kErrorInvalidRelocEntry);

        // First try whether a relative 32-bit displacement would work.
        value -= baseAddress + sectionOffset + sourceOffset + regionSize;
        if (!Support::isInt32(int64_t(value))) {
          // Relative 32-bit displacement is not possible, use '.addrtab' section.
          AddressTableEntry* atEntry = _addressTableEntries.get(re->payload());
          if (ASMJIT_UNLIKELY(!atEntry))
            return DebugUtils::errored(kErrorInvalidRelocEntry);

          // Cannot be null as we have just matched the `AddressTableEntry`.
          ASMJIT_ASSERT(addressTableSection != nullptr);

          if (!atEntry->hasAssignedSlot())
            atEntry->_slot = addressTableEntryCount++;

          size_t atEntryIndex = size_t(atEntry->slot()) * addressSize;
          uint64_t addrSrc = sectionOffset + sourceOffset + regionSize;
          uint64_t addrDst = addressTableSection->offset() + uint64_t(atEntryIndex);

          value = addrDst - addrSrc;
          if (!Support::isInt32(int64_t(value)))
            return DebugUtils::errored(kErrorRelocOffsetOutOfRange);

          // Bytes that replace [REX, OPCODE] bytes.
          uint32_t byte0 = 0xFF;
          uint32_t byte1 = buffer[valueOffset - 1];

          if (byte1 == 0xE8) {
            // Patch CALL/MOD byte to FF /2 (-> 0x15).
            byte1 = x86EncodeMod(0, 2, 5);
          }
          else if (byte1 == 0xE9) {
            // Patch JMP/MOD byte to FF /4 (-> 0x25).
            byte1 = x86EncodeMod(0, 4, 5);
          }
          else {
            return DebugUtils::errored(kErrorInvalidRelocEntry);
          }

          // Patch `jmp/call` instruction.
          buffer[valueOffset - 2] = uint8_t(byte0);
          buffer[valueOffset - 1] = uint8_t(byte1);

          Support::writeU64uLE(addressTableEntryData + atEntryIndex, re->payload());
        }
        break;
      }

      default:
        return DebugUtils::errored(kErrorInvalidRelocEntry);
    }

    if (!CodeWriterUtils::writeOffset(buffer + re->sourceOffset(), int64_t(value), re->format())) {
      return DebugUtils::errored(kErrorInvalidRelocEntry);
    }
  }

  // Fixup the virtual size of the address table if it's the last section.
  if (_sectionsByOrder.last() == addressTableSection) {
    ASMJIT_ASSERT(addressTableSection != nullptr);

    size_t addressTableSize = addressTableEntryCount * addressSize;
    addressTableSection->_buffer._size = addressTableSize;
    addressTableSection->_virtualSize = addressTableSize;
  }

  return kErrorOk;
}